

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.cpp
# Opt level: O0

void __thiscall
stateObservation::IndexedMatrixArray::writeInFile(IndexedMatrixArray *this,char *filename)

{
  uint uVar1;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *this_00;
  Index IVar2;
  ostream *this_01;
  Scalar *pSVar3;
  int local_240;
  int local_23c;
  int j;
  int i;
  Matrix *m;
  size_t k;
  ostream local_218 [8];
  ofstream f;
  char *filename_local;
  IndexedMatrixArray *this_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open(local_218,filename,0x10);
  uVar1 = size(this);
  if (uVar1 != 0) {
    uVar1 = getFirstIndex(this);
    for (m = (Matrix *)(ulong)uVar1; uVar1 = getLastIndex(this), m <= (Matrix *)(ulong)uVar1;
        m = (Matrix *)
            ((long)&(m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                    m_data + 1)) {
      std::ostream::operator<<(local_218,(ulong)m);
      this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                operator[](this,(uint)m);
      for (local_23c = 0;
          IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00),
          local_23c < IVar2; local_23c = local_23c + 1) {
        for (local_240 = 0;
            IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00
                              ), local_240 < IVar2; local_240 = local_240 + 1) {
          this_01 = std::operator<<(local_218," ");
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                             (this_00,(long)local_23c,(long)local_240);
          std::ostream::operator<<(this_01,*pSVar3);
        }
      }
      std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void IndexedMatrixArray::writeInFile(const char * filename)
    {
    	std::ofstream f;

      f.open(filename);

      if (size()>0)
      {

        for (size_t k=getFirstIndex();k<=getLastIndex();++k)
        {

            f << k;

            Matrix & m = operator[](k);

            for (int i = 0 ; i< m.rows(); ++i)
            {
              for (int j = 0 ; j< m.cols(); ++j)
              {
            		f << " "<< m(i,j);
              }
            }

            f << std::endl;
        }
      }
    }